

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall kj::anon_unknown_36::HttpOutputStream::~HttpOutputStream(HttpOutputStream *this)

{
  PromiseArenaMember *node;
  
  node = &((this->writeQueue).super_PromiseBase.node.ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->writeQueue).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>::~WrappableStreamMixin
            (&this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>);
  return;
}

Assistant:

HttpOutputStream(AsyncOutputStream& inner): inner(inner) {}